

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

void __thiscall S2Polygon::InitFromBuilder(S2Polygon *this,S2Polygon *a,S2Builder *builder)

{
  bool bVar1;
  ostream *os;
  double dVar2;
  _Head_base<0UL,_S2Builder::Layer_*,_false> local_60;
  S2Polygon *local_58;
  ostream *local_50;
  S2Error error;
  
  local_58 = this;
  absl::make_unique<s2builderutil::S2PolygonLayer,S2Polygon*>((absl *)&error,&local_58);
  local_60._M_head_impl = (Layer *)error._0_8_;
  error.code_ = OK;
  error._4_4_ = 0;
  S2Builder::StartLayer
            (builder,(unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *)
                     &local_60);
  if (local_60._M_head_impl != (Layer *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Layer[1])();
  }
  local_60._M_head_impl = (Layer *)0x0;
  if (error._0_8_ != 0) {
    (**(code **)(*(long *)error._0_8_ + 8))();
  }
  S2Builder::AddPolygon(builder,a);
  error._0_8_ = error._0_8_ & 0xffffffff00000000;
  error.text_._M_dataplus._M_p = (pointer)&error.text_.field_2;
  error.text_._M_string_length = 0;
  error.text_.field_2._M_local_buf[0] = '\0';
  bVar1 = S2Builder::Build(builder,&error);
  if (bVar1) {
    if ((int)((ulong)((long)(this->loops_).
                            super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->loops_).
                           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) == 0) {
      dVar2 = S2LatLngRect::Area(&a->bound_);
      if (6.283185307179586 < dVar2) {
        dVar2 = GetArea(a);
        if (6.283185307179586 < dVar2) {
          Invert(this);
        }
      }
    }
    std::__cxx11::string::~string((string *)&error.text_);
    return;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x3da,kFatal,(ostream *)&std::cerr);
  os = std::operator<<(local_50,"Could not build polygon: ");
  ::operator<<(os,&error);
  abort();
}

Assistant:

void S2Polygon::InitFromBuilder(const S2Polygon& a, S2Builder* builder) {
  builder->StartLayer(make_unique<S2PolygonLayer>(this));
  builder->AddPolygon(a);
  S2Error error;
  if (!builder->Build(&error)) {
    S2_LOG(DFATAL) << "Could not build polygon: " << error;
  }
  // If there are no loops, check whether the result should be the full
  // polygon rather than the empty one.  (See InitToApproxIntersection.)
  if (num_loops() == 0) {
    if (a.bound_.Area() > 2 * M_PI && a.GetArea() > 2 * M_PI) Invert();
  }
}